

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.c
# Opt level: O2

int mapBamboo(Layer *l,int *out,int x,int z,int w,int h)

{
  uint64_t ss;
  undefined1 auVar1 [16];
  int iVar2;
  uint64_t uVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  
  iVar2 = (*l->p->getMap)(l->p,out,x,z,w,h);
  if (iVar2 == 0) {
    lVar4 = (long)w;
    lVar7 = 0;
    if (0 < lVar4) {
      lVar7 = lVar4;
    }
    ss = l->startSeed;
    if (h < 1) {
      h = 0;
    }
    for (uVar5 = 0; uVar5 != (uint)h; uVar5 = uVar5 + 1) {
      for (lVar6 = 0; lVar7 != lVar6; lVar6 = lVar6 + 1) {
        if (out[lVar6] == 0x15) {
          uVar3 = getChunkSeed(ss,x + (int)lVar6,(int)uVar5 + z);
          auVar1._8_8_ = (long)uVar3 >> 0x3f;
          auVar1._0_8_ = (long)uVar3 >> 0x18;
          if (SUB168(auVar1 % SEXT816(10),0) == 0) {
            out[lVar6] = 0xa8;
          }
        }
      }
      out = out + lVar4;
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int mapBamboo(const Layer * l, int * out, int x, int z, int w, int h)
{
    int64_t i, j;
    int err = l->p->getMap(l->p, out, x, z, w, h);
    if unlikely(err != 0)
        return err;

    uint64_t ss = l->startSeed;
    uint64_t cs;

    for (j = 0; j < h; j++)
    {
        for (i = 0; i < w; i++)
        {
            int64_t idx = i + j*w;
            if (out[idx] != jungle) continue;

            cs = getChunkSeed(ss, i + x, j + z);
            if (mcFirstIsZero(cs, 10))
            {
                out[idx] = bamboo_jungle;
            }
        }
    }

    return 0;
}